

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ClassSymbols.cpp
# Opt level: O3

Type * __thiscall
slang::ast::GenericClassDefSymbol::getSpecialization
          (GenericClassDefSymbol *this,ASTContext *context,ParameterValueAssignmentSyntax *syntax)

{
  SourceLocation instanceLoc;
  Type *pTVar1;
  Token local_28;
  
  local_28 = slang::syntax::SyntaxNode::getFirstToken(&syntax->super_SyntaxNode);
  instanceLoc = parsing::Token::location(&local_28);
  pTVar1 = getSpecializationImpl(this,context,instanceLoc,false,syntax);
  if (pTVar1 == (Type *)0x0) {
    pTVar1 = ((context->scope).ptr)->compilation->errorType;
  }
  return pTVar1;
}

Assistant:

const Type& GenericClassDefSymbol::getSpecialization(
    const ASTContext& context, const ParameterValueAssignmentSyntax& syntax) const {

    auto result = getSpecializationImpl(context, syntax.getFirstToken().location(),
                                        /* forceInvalidParams */ false, &syntax);
    if (!result)
        return context.getCompilation().getErrorType();

    return *result;
}